

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crashcatcher.c
# Opt level: O1

size_t safe_write(int fd,void *buf,size_t len)

{
  size_t in_RAX;
  ssize_t sVar1;
  int *piVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (len < uVar3 || len - uVar3 == 0) {
      return in_RAX;
    }
    sVar1 = write(fd,(void *)((long)buf + uVar3),len - uVar3);
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      in_RAX = CONCAT71((int7)((ulong)piVar2 >> 8),*piVar2 != 4);
    }
    else {
      uVar3 = uVar3 + sVar1;
      in_RAX = 0;
    }
  } while ((char)in_RAX == '\0');
  return in_RAX;
}

Assistant:

static size_t safe_write(int fd, const void *buf, size_t len)
{
	size_t ret = 0;
	while(ret < len)
	{
		ssize_t rem;
		if((rem=write(fd, (const char*)buf+ret, len-ret)) == -1)
		{
			if(errno == EINTR)
				continue;
			break;
		}
		ret += rem;
	}
	return ret;
}